

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O3

double calAngle(double tangentX,double tangentY)

{
  double dVar1;
  
  dVar1 = 1e-08;
  if (ABS(tangentX) < 1e-08) {
    if (ABS(tangentY) < 1e-08) goto LAB_001050f4;
    if (99999.0 < tangentY) {
      dVar1 = 90.0;
      goto LAB_001050f4;
    }
    if (tangentY < -99999.0) {
      dVar1 = 270.0;
      goto LAB_001050f4;
    }
  }
  dVar1 = atan(tangentY / tangentX);
  dVar1 = (dVar1 * 180.0) / 3.14159265;
  if (((tangentX < 0.0) && (tangentY < 0.0)) || ((tangentX < 0.0 && (0.0 < tangentY)))) {
    dVar1 = dVar1 + 180.0;
  }
LAB_001050f4:
  return (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                 (ulong)(dVar1 + 360.0) & -(ulong)(dVar1 < 0.0));
}

Assistant:

double calAngle(double tangentX, double tangentY)
{
    double param = tangentY / double(tangentX);
    double tol = pow(10,-8);
    double angle;
    if(abs(tangentX - 0) < tol && abs(tangentY - 0) < tol)
        angle = tol;
    else if(abs(tangentX - 0) < tol && tangentY > 99999)
        angle = 90;
    else if(abs(tangentX - 0) < tol && tangentY < -99999)
        angle = 270;
    else{
        angle = atan(param) * 180 / PI;
        if(tangentX < 0 && tangentY < 0)
            angle += 180;
        else if(tangentX < 0 && tangentY > 0)
            angle += 180;
    }
    if(angle < 0)
        angle += 360;
    return angle;
}